

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalize_fake_var_array.hpp
# Opt level: O3

void __thiscall
front::optimization::scalize_fake_var_array::ScalizeFakeVarArray::optimize_functiom
          (ScalizeFakeVarArray *this,string *funcName,MirPackage *package,
          BmirVariableTable *bmirVariableTable,
          vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
          *insts)

{
  __index_type _Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  int32_t iVar4;
  element_type *peVar5;
  pointer pcVar6;
  pointer pvVar7;
  element_type *peVar8;
  pointer piVar9;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
  *pvVar10;
  _Base_ptr p_Var11;
  int iVar12;
  variant_alternative_t<0UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar13;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar14;
  AssignInst *__p;
  mapped_type *pmVar15;
  mapped_type *pmVar16;
  variant_alternative_t<1UL,_variant<VarId,_basic_string<char>_>_> *pvVar17;
  const_iterator cVar18;
  mapped_type *pmVar19;
  mapped_type *pmVar20;
  const_iterator cVar21;
  variant_alternative_t<0UL,_variant<int,_VarId>_> *pvVar22;
  undefined8 uVar23;
  _Base_ptr p_Var24;
  ulong uVar25;
  _Base_ptr p_Var26;
  _Base_ptr p_Var27;
  const_iterator __position;
  byte bVar28;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  pVar29;
  map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  tmpVarId2Offset;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tmpVarId2VarSingleName;
  uint32_t local_1f0;
  anon_class_1_0_00000001 local_1e9;
  AssignInst *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e0;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
  *local_1d8;
  uint32_t local_1cc;
  AssignInst *local_1c8;
  BmirVariableTable *local_1c0;
  AssignInst *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  undefined1 local_1a8 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  key_type local_170;
  _func_int **local_150;
  _func_int **local_148;
  key_type local_140;
  key_type local_120;
  key_type local_100;
  key_type local_e0;
  key_type local_c0;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_90;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  __position._M_current =
       (insts->
       super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_1c0 = bmirVariableTable;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__position._M_current !=
      (insts->
      super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_1a8._40_8_ = &bmirVariableTable->name2VarSingle;
    local_98 = &(bmirVariableTable->name2VarArray)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0 = &(bmirVariableTable->name2VarSingle)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_148 = (_func_int **)&PTR_display_001ecfe8;
    local_150 = (_func_int **)&PTR_display_001ecf98;
    local_1d8 = insts;
    do {
      _Var1 = ((__position._M_current)->
              super__Variant_base<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              ).
              super__Move_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Copy_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Move_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Copy_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Variant_storage_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              ._M_index;
      if (_Var1 == '\x02') {
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
        ::clear(&local_90);
      }
      else if (_Var1 == '\0') {
        pvVar13 = std::
                  get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                            (__position._M_current);
        peVar5 = (pvVar13->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_178 = (pvVar13->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
        if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_178->_M_use_count = local_178->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_178->_M_use_count = local_178->_M_use_count + 1;
          }
        }
        iVar12 = (*(peVar5->super_Displayable)._vptr_Displayable[1])(peVar5);
        if (iVar12 == 1) {
          if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            _Var2 = (peVar5->dest).id;
            p_Var11 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var27 = &local_90._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var26 = p_Var27;
              p_Var24 = p_Var11;
              _Var3 = p_Var24[1]._M_color;
              p_Var27 = p_Var24;
              if (_Var3 < _Var2) {
                p_Var27 = p_Var26;
              }
              p_Var11 = (&p_Var24->_M_left)[_Var3 < _Var2];
            } while ((&p_Var24->_M_left)[_Var3 < _Var2] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var27 != &local_90._M_impl.super__Rb_tree_header) {
              if (_Var3 < _Var2) {
                p_Var24 = p_Var26;
              }
              if (p_Var24[1]._M_color <= _Var2) {
                if (*(char *)&peVar5[3].dest.super_Displayable._vptr_Displayable == '\0') {
                  pvVar22 = std::get<0ul,int,mir::inst::VarId>
                                      ((variant<int,_mir::inst::VarId> *)&peVar5[2].dest.id);
                  iVar12 = *pvVar22;
                  local_1b8 = (AssignInst *)CONCAT44(local_1b8._4_4_,(peVar5->dest).id);
                  pmVar19 = std::
                            map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                            ::operator[]((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                                          *)&local_90,(key_type_conflict *)&local_1b8);
                  pmVar19->second = pmVar19->second + iVar12;
                }
                else {
                  local_1b8 = (AssignInst *)CONCAT44(local_1b8._4_4_,_Var2);
                  pVar29 = std::
                           _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                           ::equal_range(&local_90,(key_type_conflict *)&local_1b8);
                  std::
                  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                  ::_M_erase_aux(&local_90,(_Base_ptr)pVar29.first._M_node,
                                 (_Base_ptr)pVar29.second._M_node);
                }
              }
            }
          }
        }
        else if (iVar12 == 2) {
          if (*(char *)&peVar5[2].dest.super_Displayable._vptr_Displayable == '\x01') {
            pvVar17 = std::get<1ul,mir::inst::VarId,std::__cxx11::string>
                                ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)(peVar5 + 1));
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            pcVar6 = (pvVar17->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e0,pcVar6,pcVar6 + pvVar17->_M_string_length);
            cVar18 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                             *)local_1c0,&local_e0);
            if (cVar18._M_node == local_98) {
              bVar28 = 0;
            }
            else {
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              pcVar6 = (pvVar17->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_100,pcVar6,pcVar6 + pvVar17->_M_string_length);
              pmVar20 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                        ::at(&local_1c0->name2VarArray,&local_100);
              bVar28 = ((pmVar20->
                        super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr)->changed ^ 1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if (bVar28 == 0) {
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              pcVar6 = (pvVar17->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_120,pcVar6,pcVar6 + pvVar17->_M_string_length);
              cVar21 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                               *)local_1a8._40_8_,&local_120);
              if (cVar21._M_node == local_a0) {
                bVar28 = 0;
              }
              else {
                local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                pcVar6 = (pvVar17->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_140,pcVar6,pcVar6 + pvVar17->_M_string_length);
                pmVar16 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                          ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                                *)local_1a8._40_8_,&local_140);
                bVar28 = ((pmVar16->
                          super___shared_ptr<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->changed ^ 1;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_140._M_dataplus._M_p != &local_140.field_2) {
                  operator_delete(local_140._M_dataplus._M_p,
                                  local_140.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              if (bVar28 != 0) {
                local_1b8 = (AssignInst *)CONCAT44(local_1b8._4_4_,(peVar5->dest).id);
                pmVar15 = std::
                          map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&local_60,(key_type_conflict *)&local_1b8);
                std::__cxx11::string::_M_assign((string *)pmVar15);
              }
            }
            else {
              local_1b8 = (AssignInst *)local_1a8;
              pcVar6 = (pvVar17->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1b8,pcVar6,pcVar6 + pvVar17->_M_string_length);
              local_1a8._16_4_ = 0;
              local_1e8 = (AssignInst *)CONCAT44(local_1e8._4_4_,(peVar5->dest).id);
              pmVar19 = std::
                        map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                        ::operator[]((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                                      *)&local_90,(key_type_conflict *)&local_1e8);
              std::__cxx11::string::operator=((string *)pmVar19,(string *)&local_1b8);
              pmVar19->second = local_1a8._16_4_;
              if (local_1b8 != (AssignInst *)local_1a8) {
                operator_delete(local_1b8,CONCAT71(local_1a8._1_7_,local_1a8[0]) + 1);
              }
            }
          }
        }
        else if (iVar12 == 3) {
          pvVar14 = std::get<1ul,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)&peVar5[1].dest);
          _Var2 = pvVar14->id;
          if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var11 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var27 = &local_90._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var26 = p_Var27;
              p_Var24 = p_Var11;
              _Var3 = p_Var24[1]._M_color;
              p_Var27 = p_Var24;
              if (_Var3 < _Var2) {
                p_Var27 = p_Var26;
              }
              p_Var11 = (&p_Var24->_M_left)[_Var3 < _Var2];
            } while ((&p_Var24->_M_left)[_Var3 < _Var2] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var27 != &local_90._M_impl.super__Rb_tree_header) {
              if (_Var3 < _Var2) {
                p_Var24 = p_Var26;
              }
              if (p_Var24[1]._M_color <= _Var2) {
                pvVar7 = (local_1d8->
                         super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_1c8 = (AssignInst *)operator_new(0x38);
                local_1a8._32_4_ = (peVar5->dest).id;
                local_1f0 = pvVar14->id;
                pmVar19 = std::
                          map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                          ::operator[]((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                                        *)&local_90,&local_1f0);
                local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                pcVar6 = (pmVar19->first)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_170,pcVar6,pcVar6 + (pmVar19->first)._M_string_length);
                pmVar20 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                          ::at(&local_1c0->name2VarArray,&local_170);
                peVar8 = (pmVar20->
                         super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr;
                local_1cc = pvVar14->id;
                pmVar19 = std::
                          map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                          ::operator[]((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                                        *)&local_90,&local_1cc);
                uVar25 = (ulong)(pmVar19->second >> 2);
                piVar9 = (peVar8->initValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(peVar8->initValues).super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)piVar9 >> 2) <=
                    uVar25) {
                  uVar23 = std::__throw_out_of_range_fmt
                                     (
                                     "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                     );
                  if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
                  }
                  std::
                  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~_Rb_tree(&local_60);
                  std::
                  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                  ::~_Rb_tree(&local_90);
                  _Unwind_Resume(uVar23);
                }
                iVar12 = piVar9[uVar25];
                (local_1c8->super_Inst).dest.super_Displayable._vptr_Displayable =
                     (_func_int **)&PTR_display_001eb100;
                (local_1c8->super_Inst).dest.id = local_1a8._32_4_;
                (local_1c8->super_Inst).super_Displayable._vptr_Displayable = local_148;
                (local_1c8->src).field_0x18 = 0;
                *(int *)&(local_1c8->src).field_0x8 = iVar12;
                (local_1c8->src).super_Displayable._vptr_Displayable = local_150;
                (local_1c8->src).shift = Lsl;
                (local_1c8->src).shift_amount = '\0';
                local_1e8 = local_1c8;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mir::inst::AssignInst*>(&_Stack_1e0,local_1c8);
                pvVar10 = local_1d8;
                local_1b8 = local_1e8;
                p_Stack_1b0 = _Stack_1e0._M_pi;
                local_1e8 = (AssignInst *)0x0;
                _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_1a8[0] = 0;
                std::
                vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                ::_M_insert_rval(local_1d8,__position,(value_type *)&local_1b8);
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
                  ::_S_vtable._M_arr[local_1a8[0]]._M_data)
                          (&local_1e9,
                           (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                            *)&local_1b8);
                local_1a8[0] = 0xff;
                if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._M_dataplus._M_p != &local_170.field_2) {
                  operator_delete(local_170._M_dataplus._M_p,
                                  local_170.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                ::_M_erase(pvVar10,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                    *)((long)__position._M_current +
                                      (long)(pvVar10->
                                            super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start +
                                      (0x18 - (long)pvVar7)));
                goto LAB_00143491;
              }
            }
          }
          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var27 = &local_60._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var26 = p_Var27;
              p_Var24 = p_Var11;
              _Var3 = p_Var24[1]._M_color;
              p_Var27 = p_Var24;
              if (_Var3 < _Var2) {
                p_Var27 = p_Var26;
              }
              p_Var11 = (&p_Var24->_M_left)[_Var3 < _Var2];
            } while ((&p_Var24->_M_left)[_Var3 < _Var2] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var27 != &local_60._M_impl.super__Rb_tree_header) {
              if (_Var3 < _Var2) {
                p_Var24 = p_Var26;
              }
              if (p_Var24[1]._M_color <= _Var2) {
                local_1a8._32_8_ =
                     (long)__position._M_current -
                     (long)(local_1d8->
                           super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                __p = (AssignInst *)operator_new(0x38);
                local_1c8 = (AssignInst *)CONCAT44(local_1c8._4_4_,(peVar5->dest).id);
                local_1f0 = pvVar14->id;
                pmVar15 = std::
                          map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&local_60,&local_1f0);
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                pcVar6 = (pmVar15->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_c0,pcVar6,pcVar6 + pmVar15->_M_string_length);
                pmVar16 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                          ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                                *)local_1a8._40_8_,&local_c0);
                iVar4 = ((pmVar16->
                         super___shared_ptr<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->initValue;
                (__p->super_Inst).dest.super_Displayable._vptr_Displayable =
                     (_func_int **)&PTR_display_001eb100;
                (__p->super_Inst).dest.id = (uint32_t)local_1c8;
                (__p->super_Inst).super_Displayable._vptr_Displayable = local_148;
                (__p->src).field_0x18 = 0;
                *(int32_t *)&(__p->src).field_0x8 = iVar4;
                (__p->src).super_Displayable._vptr_Displayable = local_150;
                (__p->src).shift = Lsl;
                (__p->src).shift_amount = '\0';
                local_1e8 = __p;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mir::inst::AssignInst*>(&_Stack_1e0,__p);
                pvVar10 = local_1d8;
                local_1b8 = local_1e8;
                p_Stack_1b0 = _Stack_1e0._M_pi;
                local_1e8 = (AssignInst *)0x0;
                _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_1a8[0] = 0;
                std::
                vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                ::_M_insert_rval(local_1d8,__position,(value_type *)&local_1b8);
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
                  ::_S_vtable._M_arr[local_1a8[0]]._M_data)
                          ((anon_class_1_0_00000001 *)&local_1cc,
                           (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                            *)&local_1b8);
                local_1a8[0] = 0xff;
                if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                ::_M_erase(pvVar10,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                    *)((long)&(pvVar10->
                                              super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start[1].
                                              super__Variant_base<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                              .
                                              super__Move_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                              .
                                              super__Copy_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                              .
                                              super__Move_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                              .
                                              super__Copy_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                              .
                                              super__Variant_storage_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                              ._M_u + local_1a8._32_8_));
              }
            }
          }
        }
LAB_00143491:
        insts = local_1d8;
        if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
        }
      }
      __position._M_current = __position._M_current + 1;
    } while (__position._M_current !=
             (insts->
             super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::~_Rb_tree(&local_90);
  return;
}

Assistant:

void optimize_functiom(
      std::string funcName, mir::inst::MirPackage& package,
      bmir_variable_table::BmirVariableTable& bmirVariableTable,
      std::vector<irGenerator::Instruction>& insts) {
    std::map<uint32_t, std::pair<std::string, uint32_t>> tmpVarId2Offset;
    std::map<uint32_t, std::string> tmpVarId2VarSingleName;
    for (auto instructionIter = insts.begin(); instructionIter != insts.end();
         instructionIter++) {
      if (instructionIter->index() == 0) {
        std::shared_ptr<mir::inst::Inst> mirInst =
            std::get<std::shared_ptr<mir::inst::Inst>>(*instructionIter);
        switch (mirInst->inst_kind()) {
          case mir::inst::InstKind::Ref: {
            mir::inst::RefInst* refInst = (mir::inst::RefInst*)mirInst.get();
            if (std::holds_alternative<std::string>(refInst->val)) {
              std::string& varName = std::get<std::string>(refInst->val);
              if (bmirVariableTable.hasNameKey(varName) &&
                  !bmirVariableTable.getVarArray(varName)->changed) {
                tmpVarId2Offset[refInst->dest] = {varName, 0};
              } else if (bmirVariableTable.hasVarSingle(varName) &&
                         !bmirVariableTable.getVarSingle(varName)->changed) {
                tmpVarId2VarSingleName[refInst->dest] = varName;
              }
            }
            break;
          }
          case mir::inst::InstKind::Load: {
            mir::inst::LoadInst* loadInst = (mir::inst::LoadInst*)mirInst.get();
            mir::inst::VarId& src = std::get<mir::inst::VarId>(loadInst->src);
            if (tmpVarId2Offset.count(src) > 0) {
              size_t index = instructionIter - insts.begin();
              insts.insert(
                  insts.begin() + index,
                  std::shared_ptr<mir::inst::AssignInst>(
                      new mir::inst::AssignInst(
                          loadInst->dest,
                          mir::inst::Value(
                              bmirVariableTable
                                  .getVarArray(tmpVarId2Offset[src].first)
                                  ->initValues.at(tmpVarId2Offset[src].second /
                                                  mir::types::INT_SIZE)))));
              insts.erase(insts.begin() + index + 1);
            } else if (tmpVarId2VarSingleName.count(src) > 0) {
              size_t index = instructionIter - insts.begin();
              insts.insert(
                  insts.begin() + index,
                  std::shared_ptr<mir::inst::AssignInst>(
                      new mir::inst::AssignInst(
                          loadInst->dest,
                          mir::inst::Value(
                              bmirVariableTable
                                  .getVarSingle(tmpVarId2VarSingleName[src])
                                  ->initValue))));
              insts.erase(insts.begin() + index + 1);
            }
            break;
          }
          case mir::inst::InstKind::Op: {
            mir::inst::OpInst* opInst = (mir::inst::OpInst*)mirInst.get();
            if (tmpVarId2Offset.count(opInst->dest) > 0) {
              if (std::holds_alternative<int32_t>(opInst->rhs)) {
                tmpVarId2Offset[opInst->dest].second +=
                    std::get<int32_t>(opInst->rhs);
              } else {
                tmpVarId2Offset.erase(opInst->dest);
              }
            }
            break;
          }
          default:
            break;
        }
      } else if (instructionIter->index() == 2) {
        tmpVarId2Offset.clear();
      }
    }
  }